

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.hpp
# Opt level: O3

void __thiscall StrX::StrX(StrX *this,XMLCh *toTranscode)

{
  short *psVar1;
  XMLCh *__dest;
  char *pcVar2;
  size_t __n;
  
  if (toTranscode == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)toTranscode + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    __dest = (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,__n);
    memcpy(__dest,toTranscode,__n);
  }
  this->fUnicodeForm = __dest;
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (toTranscode,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this->fLocalForm = pcVar2;
  return;
}

Assistant:

StrX(const XMLCh* const toTranscode)
    {
        fUnicodeForm = XMLString::replicate(toTranscode);
        fLocalForm   = XMLString::transcode(toTranscode);
    }